

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::getElementAttValue
          (TraverseSchema *this,DOMElement *elem,XMLCh *attName,ValidatorType attType)

{
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  ulong uVar4;
  undefined2 *puVar5;
  XMLStringPool *pXVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  XMLCh *toCheck;
  ulong uVar12;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  long lVar13;
  short sVar14;
  long lVar15;
  ushort *puVar16;
  size_t __n;
  XMLCh *unaff_R15;
  ArrayJanitor<char16_t> tempName;
  ArrayJanitor<char16_t> AStack_38;
  long *plVar11;
  undefined4 extraout_var_00;
  
  iVar9 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,attName);
  plVar11 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar11 == (long *)0x0) {
    toCheck = (XMLCh *)0x0;
  }
  else {
    toCheck = (XMLCh *)(**(code **)(*plVar11 + 0x150))(plVar11);
    if ((int)attType < 0x14) {
      if (getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
          ::bInitialized == '\0') {
        getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
        ::bInitialized = '\x01';
        uVar4 = *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18);
        uVar12 = 0x73;
        uVar3 = 0x74;
        puVar16 = &DAT_00372914;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        lVar13 = *(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_STRING) {
          sVar14 = 0x73;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329190:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_STRING + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329190;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x61;
        uVar3 = 0x6e;
        puVar16 = &DAT_00372bee;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_ANYURI) {
          sVar14 = 0x61;
          if (puVar5 == (undefined2 *)0x0) {
LAB_0032923a:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_ANYURI + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_0032923a;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[1] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x51;
        uVar3 = 0x4e;
        puVar16 = &DAT_00372bfc;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_QNAME) {
          sVar14 = 0x51;
          if (puVar5 == (undefined2 *)0x0) {
LAB_003292e4:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_003292e4;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[2] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x4e;
        uVar3 = 0x61;
        puVar16 = &DAT_00372946;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_NAME) {
          sVar14 = 0x4e;
          if (puVar5 == (undefined2 *)0x0) {
LAB_0032938e:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_NAME + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_0032938e;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[3] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x4e;
        uVar3 = 0x43;
        puVar16 = &DAT_00372950;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_NCNAME) {
          sVar14 = 0x4e;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329438:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_NCNAME + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329438;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[4] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x62;
        uVar3 = 0x6f;
        puVar16 = &DAT_00372984;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_BOOLEAN) {
          sVar14 = 0x62;
          if (puVar5 == (undefined2 *)0x0) {
LAB_003294e2:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_003294e2;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[5] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x66;
        uVar3 = 0x6c;
        puVar16 = &DAT_00372bb8;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_FLOAT) {
          sVar14 = 0x66;
          if (puVar5 == (undefined2 *)0x0) {
LAB_0032958c:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_FLOAT + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_0032958c;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[6] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x6f;
        puVar16 = &DAT_00372bc4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DOUBLE) {
          sVar14 = 100;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329636:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DOUBLE + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329636;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[7] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x65;
        puVar16 = &DAT_00372974;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DECIMAL) {
          sVar14 = 100;
          if (puVar5 == (undefined2 *)0x0) {
LAB_003296e0:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DECIMAL + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_003296e0;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[8] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x68;
        uVar3 = 0x65;
        puVar16 = &DAT_00372ba4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_HEXBINARY) {
          sVar14 = 0x68;
          if (puVar5 == (undefined2 *)0x0) {
LAB_0032978a:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_HEXBINARY + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_0032978a;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[9] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x62;
        uVar3 = 0x61;
        puVar16 = &DAT_00372b84;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_BASE64BINARY) {
          sVar14 = 0x62;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329834:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_BASE64BINARY + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329834;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[10] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x75;
        puVar16 = &DAT_00372b14;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DURATION) {
          sVar14 = 100;
          if (puVar5 == (undefined2 *)0x0) {
LAB_003298de:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DURATION + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_003298de;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0xb] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x61;
        puVar16 = &DAT_00372ae4;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DATETIME) {
          sVar14 = 100;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329988:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DATETIME + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329988;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0xc] = *(short *)(*plVar11 + 0xc);
        uVar12 = 100;
        uVar3 = 0x61;
        puVar16 = &DAT_00372af6;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DATE) {
          sVar14 = 100;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329a32:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DATE + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329a32;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0xd] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x74;
        uVar3 = 0x69;
        puVar16 = &DAT_00372b00;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_TIME) {
          sVar14 = 0x74;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329adc:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_TIME + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329adc;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0xe] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x4d;
        puVar16 = &DAT_00372b44;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_MONTHDAY) {
          sVar14 = 0x67;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329b86:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_MONTHDAY + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329b86;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0xf] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x59;
        puVar16 = &DAT_00372b64;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_YEARMONTH) {
          sVar14 = 0x67;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329c30:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_YEARMONTH + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329c30;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0x10] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x59;
        puVar16 = &DAT_00372b58;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_YEAR) {
          sVar14 = 0x67;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329cda:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_YEAR + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329cda;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0x11] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x4d;
        puVar16 = &DAT_00372b30;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_MONTH) {
          sVar14 = 0x67;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329d84:
            if (sVar14 == 0) break;
          }
          else {
            lVar15 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_MONTH + lVar15);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar15);
                goto LAB_00329d84;
              }
              psVar2 = (short *)((long)puVar5 + lVar15);
              lVar15 = lVar15 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0x12] = *(short *)(*plVar11 + 0xc);
        uVar12 = 0x67;
        uVar3 = 0x44;
        puVar16 = &DAT_00372b26;
        do {
          uVar12 = (ulong)uVar3 + (uVar12 >> 0x18) + uVar12 * 0x26;
          uVar3 = *puVar16;
          puVar16 = puVar16 + 1;
        } while (uVar3 != 0);
        plVar11 = *(long **)(lVar13 + (uVar12 % uVar4) * 8);
        puVar5 = (undefined2 *)plVar11[2];
        while (puVar5 != &SchemaSymbols::fgDT_DAY) {
          sVar14 = 0x67;
          if (puVar5 == (undefined2 *)0x0) {
LAB_00329e29:
            if (sVar14 == 0) break;
          }
          else {
            lVar13 = 0;
            do {
              psVar1 = (short *)((long)&SchemaSymbols::fgDT_DAY + lVar13);
              if (*psVar1 == 0) {
                sVar14 = *(short *)((long)puVar5 + lVar13);
                goto LAB_00329e29;
              }
              psVar2 = (short *)((long)puVar5 + lVar13);
              lVar13 = lVar13 + 2;
            } while (*psVar1 == *psVar2);
          }
          plVar11 = (long *)plVar11[1];
          puVar5 = (undefined2 *)plVar11[2];
        }
        getElementAttValue::wsFacets[0x13] = *(short *)(*plVar11 + 0xc);
      }
      sVar14 = getElementAttValue::wsFacets[attType];
      if (((sVar14 == 1) && (bVar7 = XMLString::isWSReplaced(toCheck), !bVar7)) ||
         ((bVar7 = true, sVar14 == 2 && (bVar8 = XMLString::isWSCollapsed(toCheck), !bVar8)))) {
        if (toCheck == (XMLCh *)0x0) {
          toDelete = (XMLCh *)0x0;
        }
        else {
          __n = 0;
          do {
            psVar1 = (short *)((long)toCheck + __n);
            __n = __n + 2;
          } while (*psVar1 != 0);
          iVar9 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
          toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar9);
          memcpy(toDelete,toCheck,__n);
        }
        ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,toDelete,this->fMemoryManager);
        if (sVar14 == 1) {
          XMLString::replaceWS(toDelete,this->fMemoryManager);
        }
        else if (sVar14 == 2) {
          XMLString::collapseWS(toDelete,this->fMemoryManager);
        }
        if (*toDelete == L'\0') {
          unaff_R15 = L"";
        }
        else {
          pXVar6 = this->fStringPool;
          uVar10 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[5])(pXVar6,toDelete);
          iVar9 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[10])(pXVar6,(ulong)uVar10);
          unaff_R15 = (XMLCh *)CONCAT44(extraout_var_01,iVar9);
        }
        ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
        bVar7 = false;
      }
      if (!bVar7) {
        return unaff_R15;
      }
    }
  }
  return toCheck;
}

Assistant:

const XMLCh* TraverseSchema::getElementAttValue(const DOMElement* const elem,
                                                const XMLCh* const attName,
                                                const DatatypeValidator::ValidatorType attType /* = UnKnown */) {

    DOMAttr* attNode = elem->getAttributeNode(attName);

    if (attNode == 0) {
        return 0;
    }

    const XMLCh* attValue = attNode->getValue();

    if (attType < DatatypeValidator::ID) {
        static bool bInitialized = false;
        static short wsFacets[DatatypeValidator::ID] = {0};
        if(!bInitialized)
        {
            bInitialized=true;
            DVHashTable* registry = DatatypeValidatorFactory::getBuiltInRegistry();
            wsFacets[DatatypeValidator::String]      = registry->get(SchemaSymbols::fgDT_STRING)->getWSFacet();
            wsFacets[DatatypeValidator::AnyURI]      = registry->get(SchemaSymbols::fgDT_ANYURI)->getWSFacet();
            wsFacets[DatatypeValidator::QName]       = registry->get(SchemaSymbols::fgDT_QNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Name]        = registry->get(SchemaSymbols::fgDT_NAME)->getWSFacet();
            wsFacets[DatatypeValidator::NCName]      = registry->get(SchemaSymbols::fgDT_NCNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Boolean]     = registry->get(SchemaSymbols::fgDT_BOOLEAN)->getWSFacet();
            wsFacets[DatatypeValidator::Float]       = registry->get(SchemaSymbols::fgDT_FLOAT)->getWSFacet();
            wsFacets[DatatypeValidator::Double]      = registry->get(SchemaSymbols::fgDT_DOUBLE)->getWSFacet();
            wsFacets[DatatypeValidator::Decimal]     = registry->get(SchemaSymbols::fgDT_DECIMAL)->getWSFacet();
            wsFacets[DatatypeValidator::HexBinary]   = registry->get(SchemaSymbols::fgDT_HEXBINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Base64Binary]= registry->get(SchemaSymbols::fgDT_BASE64BINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Duration]    = registry->get(SchemaSymbols::fgDT_DURATION)->getWSFacet();
            wsFacets[DatatypeValidator::DateTime]    = registry->get(SchemaSymbols::fgDT_DATETIME)->getWSFacet();
            wsFacets[DatatypeValidator::Date]        = registry->get(SchemaSymbols::fgDT_DATE)->getWSFacet();
            wsFacets[DatatypeValidator::Time]        = registry->get(SchemaSymbols::fgDT_TIME)->getWSFacet();
            wsFacets[DatatypeValidator::MonthDay]    = registry->get(SchemaSymbols::fgDT_MONTHDAY)->getWSFacet();
            wsFacets[DatatypeValidator::YearMonth]   = registry->get(SchemaSymbols::fgDT_YEARMONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Year]        = registry->get(SchemaSymbols::fgDT_YEAR)->getWSFacet();
            wsFacets[DatatypeValidator::Month]       = registry->get(SchemaSymbols::fgDT_MONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Day]         = registry->get(SchemaSymbols::fgDT_DAY)->getWSFacet();
        }
        short wsFacet = wsFacets[attType];
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(attValue)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(attValue)))
        {
            XMLCh* normalizedValue=XMLString::replicate(attValue, fMemoryManager);
            ArrayJanitor<XMLCh> tempName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            if (!*normalizedValue)
                return XMLUni::fgZeroLenString;
            return fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
    }

    return attValue;
}